

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

int __thiscall QDtls::shutdown(QDtls *this,int __fd,int __how)

{
  long *plVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    if (lVar6 == 0) {
      lVar2 = *(long *)(*plVar1 + -0x60);
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x2850e2);
      lVar6 = *(long *)((long)plVar1 + lVar2);
      uVar5 = 1;
    }
    else {
      cVar3 = (**(code **)(*plVar1 + 0x98))(plVar1,lVar6,CONCAT44(in_register_00000014,__how));
      if (cVar3 != '\0') {
        uVar5 = (**(code **)(*plVar1 + 200))(plVar1,lVar6);
        iVar4 = (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
        goto LAB_0025b2ff;
      }
      lVar2 = *(long *)(*plVar1 + -0x60);
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x285294);
      lVar6 = *(long *)((long)plVar1 + lVar2);
      uVar5 = 2;
    }
    (**(code **)(lVar6 + 0x10))((long)plVar1 + lVar2,uVar5,local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
  }
  iVar4 = 0;
LAB_0025b2ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::shutdown(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters,
                              tr("Invalid (nullptr) socket"));
        return false;
    }

    if (!backend->isConnectionEncrypted()) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot send shutdown alert, not encrypted"));
        return false;
    }

    backend->sendShutdownAlert(socket);
    return true;
}